

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *p_Var1;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_419;
  size_t local_418;
  _Storage<unsigned_long,_true> local_410;
  undefined8 local_408;
  allocator<char> local_3f9;
  string local_3f8;
  Err local_3d8;
  Err local_3b8;
  Err *local_398;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  undefined1 local_348 [8];
  MaybeResult<wasm::Ok> inst_1;
  NullCtx nullCtx;
  optional<unsigned_long> local_2c0;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_2b0;
  allocator<char> local_291;
  string local_290;
  Err local_270;
  Err local_250;
  Err *local_230;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> blockinst;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> annotations;
  string local_1b8;
  Err local_198;
  Err local_178;
  Err *local_158;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> inst;
  WithPosition<wasm::WATParser::ParseModuleTypesCtx> with;
  string local_d0;
  Err local_b0;
  Index local_90 [2];
  type info;
  undefined1 local_50 [8];
  vector<InstrInfo,_std::allocator<InstrInfo>_> foldedInstrs;
  ParseModuleTypesCtx *ctx_local;
  
  bVar2 = Lexer::peekLParen(&ctx->in);
  if (bVar2) {
    expected = sv("then",4);
    bVar2 = Lexer::peekSExprStart(&ctx->in,expected);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"else");
      bVar2 = Lexer::peekSExprStart(&ctx->in,stack0xffffffffffffffc8);
      if (!bVar2) {
        std::vector<InstrInfo,_std::allocator<InstrInfo>_>::vector
                  ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
        do {
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (bVar2) {
            pvVar5 = std::vector<InstrInfo,_std::allocator<InstrInfo>_>::back
                               ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
            foldedinstr<wasm::WATParser::ParseModuleTypesCtx>::InstrInfo::InstrInfo
                      ((InstrInfo *)local_90,pvVar5);
            bVar2 = std::optional::operator_cast_to_bool((optional *)&info);
            if (bVar2) {
              std::vector<InstrInfo,_std::allocator<InstrInfo>_>::pop_back
                        ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
              WithPosition<wasm::WATParser::ParseModuleTypesCtx>::WithPosition
                        ((WithPosition<wasm::WATParser::ParseModuleTypesCtx> *)
                         ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx
                         ,local_90[0]);
              plaininstr<wasm::WATParser::ParseModuleTypesCtx>
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx
                         ,(vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                           *)&info.end.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._M_engaged);
              bVar2 = wasm::MaybeResult::operator_cast_to_bool
                                ((MaybeResult *)
                                 ((long)&_val.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20));
              if (!bVar2) {
                __assert_fail("inst && \"unexpectedly failed to parse instruction\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                              ,0x3fa,
                              "MaybeResult<> wasm::WATParser::foldedinstr(Ctx &) [Ctx = wasm::WATParser::ParseModuleTypesCtx]"
                             );
              }
              MaybeResult<wasm::Ok>::MaybeResult
                        ((MaybeResult<wasm::Ok> *)&err,
                         (MaybeResult<wasm::Ok> *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              local_158 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
              bVar2 = local_158 != (Err *)0x0;
              if (bVar2) {
                wasm::Err::Err(&local_178,local_158);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_178);
                wasm::Err::~Err(&local_178);
              }
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar2;
              MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
              if ((uint)with.annotations.
                        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
                sVar3 = Lexer::getPos(&ctx->in);
                puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&info);
                if (sVar3 == *puVar4) {
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1b8,"expected end of instruction",
                             (allocator<char> *)
                             ((long)&annotations.
                                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  Lexer::err(&local_198,&ctx->in,&local_1b8);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_198);
                  wasm::Err::~Err(&local_198);
                  std::__cxx11::string::~string((string *)&local_1b8);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&annotations.
                                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
              }
              MaybeResult<wasm::Ok>::~MaybeResult
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              WithPosition<wasm::WATParser::ParseModuleTypesCtx>::~WithPosition
                        ((WithPosition<wasm::WATParser::ParseModuleTypesCtx> *)
                         ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"unexpected end of folded instruction",
                         (allocator<char> *)
                         ((long)&with.annotations.
                                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              Lexer::err(&local_b0,&ctx->in,&local_d0);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_b0);
              wasm::Err::~Err(&local_b0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&with.annotations.
                                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
            foldedinstr<wasm::WATParser::ParseModuleTypesCtx>::InstrInfo::~InstrInfo
                      ((InstrInfo *)local_90);
joined_r0x024297b0:
            if ((uint)with.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != 3) goto LAB_02429ea7;
          }
          else {
            p_Var1 = (__index_type *)
                     ((long)&blockinst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
            Lexer::takeAnnotations
                      ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)p_Var1,&ctx->in);
            foldedBlockinstr<wasm::WATParser::ParseModuleTypesCtx>
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx,
                       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)p_Var1);
            bVar2 = wasm::MaybeResult::operator_cast_to_bool
                              ((MaybeResult *)
                               ((long)&_val_1.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                               0x20));
            if (bVar2) {
              MaybeResult<wasm::Ok>::MaybeResult
                        ((MaybeResult<wasm::Ok> *)&err_1,
                         (MaybeResult<wasm::Ok> *)
                         ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              local_230 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
              bVar2 = local_230 != (Err *)0x0;
              if (bVar2) {
                wasm::Err::Err(&local_250,local_230);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_250);
                wasm::Err::~Err(&local_250);
              }
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar2;
              MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
              if ((uint)with.annotations.
                        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
                with.annotations.
                super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
              }
            }
            else {
              with.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
            MaybeResult<wasm::Ok>::~MaybeResult
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            if ((uint)with.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
              bVar2 = Lexer::takeLParen(&ctx->in);
              if (bVar2) {
                nullCtx.in.buffer._M_str = (char *)Lexer::getPos(&ctx->in);
                std::optional<unsigned_long>::optional(&local_2c0);
                std::
                vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
                vector(&local_2b0,
                       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)((long)&blockinst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                std::vector<InstrInfo,_std::allocator<InstrInfo>_>::push_back
                          ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50,
                           (value_type *)&nullCtx.in.buffer._M_str);
                foldedinstr<wasm::WATParser::ParseModuleTypesCtx>::InstrInfo::~InstrInfo
                          ((InstrInfo *)&nullCtx.in.buffer._M_str);
                NullCtx::NullCtx((NullCtx *)
                                 ((long)&inst_1.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20),&ctx->in);
                _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
                _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_7_ = 0;
                p_Var1 = (__index_type *)
                         ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
                std::
                vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
                vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)p_Var1);
                plaininstr<wasm::WATParser::NullCtx>
                          ((MaybeResult<wasm::Ok> *)local_348,
                           (NullCtx *)
                           ((long)&inst_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                           (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            *)p_Var1);
                std::
                vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
                ~vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                bVar2 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_348);
                if (bVar2) {
                  MaybeResult<wasm::Ok>::MaybeResult
                            ((MaybeResult<wasm::Ok> *)&err_2,(MaybeResult<wasm::Ok> *)local_348);
                  local_398 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
                  bVar2 = local_398 != (Err *)0x0;
                  if (bVar2) {
                    wasm::Err::Err(&local_3b8,local_398);
                    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3b8);
                    wasm::Err::~Err(&local_3b8);
                  }
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar2;
                  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
                  if ((uint)with.annotations.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
                    Lexer::operator=(&ctx->in,(Lexer *)((long)&inst_1.val.
                                                                                                                              
                                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  + 0x20));
                    with.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3f8,"expected instruction",&local_3f9);
                  Lexer::err(&local_3d8,&ctx->in,&local_3f8);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3d8);
                  wasm::Err::~Err(&local_3d8);
                  std::__cxx11::string::~string((string *)&local_3f8);
                  std::allocator<char>::~allocator(&local_3f9);
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
                MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_348);
                if ((uint)with.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
                  pvVar5 = std::vector<InstrInfo,_std::allocator<InstrInfo>_>::back
                                     ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
                  bVar2 = std::optional::operator_cast_to_bool((optional *)&pvVar5->end);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    __assert_fail("!foldedInstrs.back().end",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                                  ,0x421,
                                  "MaybeResult<> wasm::WATParser::foldedinstr(Ctx &) [Ctx = wasm::WATParser::ParseModuleTypesCtx]"
                                 );
                  }
                  local_418 = Lexer::getPos(&ctx->in);
                  std::optional<unsigned_long>::optional<unsigned_long,_true>
                            ((optional<unsigned_long> *)&local_410,&local_418);
                  pvVar5 = std::vector<InstrInfo,_std::allocator<InstrInfo>_>::back
                                     ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
                  (pvVar5->end).super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload = local_410;
                  *(undefined8 *)
                   &(pvVar5->end).super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged = local_408;
                  with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                }
                NullCtx::~NullCtx((NullCtx *)
                                  ((long)&inst_1.val.
                                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                  0x20));
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_290,"expected folded instruction",&local_291);
                Lexer::err(&local_270,&ctx->in,&local_290);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_270);
                wasm::Err::~Err(&local_270);
                std::__cxx11::string::~string((string *)&local_290);
                std::allocator<char>::~allocator(&local_291);
                with.annotations.
                super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            ~vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)((long)&blockinst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            if ((uint)with.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != 0)
            goto joined_r0x024297b0;
          }
          bVar2 = std::vector<InstrInfo,_std::allocator<InstrInfo>_>::empty
                            ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
        } while (((bVar2 ^ 0xffU) & 1) != 0);
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_419);
        with.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
LAB_02429ea7:
        std::vector<InstrInfo,_std::allocator<InstrInfo>_>::~vector
                  ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)local_50);
        return __return_storage_ptr__;
      }
    }
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> foldedinstr(Ctx& ctx) {
  // We must have an '(' to start a folded instruction.
  if (!ctx.in.peekLParen()) {
    return {};
  }

  // Check for valid strings that look like folded instructions but are not.
  if (ctx.in.peekSExprStart("then"sv) || ctx.in.peekSExprStart("else")) {
    return {};
  }

  // A stack of (start, end) position pairs defining the positions of
  // instructions that need to be parsed after their folded children.
  struct InstrInfo {
    size_t start;
    std::optional<size_t> end;
    std::vector<Annotation> annotations;
  };
  std::vector<InstrInfo> foldedInstrs;

  do {
    if (ctx.in.takeRParen()) {
      // We've reached the end of a folded instruction. Parse it for real.
      auto info = std::move(foldedInstrs.back());
      if (!info.end) {
        return ctx.in.err("unexpected end of folded instruction");
      }
      foldedInstrs.pop_back();

      WithPosition with(ctx, info.start);
      auto inst = plaininstr(ctx, std::move(info.annotations));
      assert(inst && "unexpectedly failed to parse instruction");
      CHECK_ERR(inst);
      // We have already parsed the instruction, so we generally know where it
      // ends. But there may have been some invalid extra immediates (e.g.
      // invalid memory indices) that we only realize are invalid now that we've
      // parsed the instruction for real.
      if (ctx.in.getPos() != *info.end) {
        return ctx.in.err("expected end of instruction");
      }
      continue;
    }

    auto annotations = ctx.in.takeAnnotations();

    // We're not ending an instruction, so we must be starting a new one. Maybe
    // it is a block instruction.
    if (auto blockinst = foldedBlockinstr(ctx, annotations)) {
      CHECK_ERR(blockinst);
      continue;
    }

    // We must be starting a new plain instruction.
    if (!ctx.in.takeLParen()) {
      return ctx.in.err("expected folded instruction");
    }
    foldedInstrs.push_back({ctx.in.getPos(), {}, std::move(annotations)});

    // Consume the span for the instruction without meaningfully parsing it yet.
    // It will be parsed for real using the real context after its s-expression
    // children have been found and parsed.
    NullCtx nullCtx(ctx.in);
    if (auto inst = plaininstr(nullCtx, {})) {
      CHECK_ERR(inst);
      ctx.in = nullCtx.in;
    } else {
      return ctx.in.err("expected instruction");
    }

    // The folded instruction we just started ends here.
    assert(!foldedInstrs.back().end);
    foldedInstrs.back().end = ctx.in.getPos();
  } while (!foldedInstrs.empty());

  return Ok{};
}